

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::EvalConstantValUint64
          (ValidationState_t *this,uint32_t id,uint64_t *val)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  Instruction *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  size_type sVar5;
  Instruction *inst;
  uint64_t *val_local;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  this_00 = FindDef(this,id);
  if (this_00 == (Instruction *)0x0) {
    __assert_fail("0 && \"Instruction not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x55e,
                  "bool spvtools::val::ValidationState_t::EvalConstantValUint64(uint32_t, uint64_t *) const"
                 );
  }
  uVar2 = Instruction::type_id(this_00);
  bVar1 = IsIntScalarType(this,uVar2);
  if (bVar1) {
    OVar3 = Instruction::opcode(this_00);
    if (OVar3 == OpConstantNull) {
      *val = 0;
    }
    else {
      OVar3 = Instruction::opcode(this_00);
      if (OVar3 != OpConstant) {
        return false;
      }
      pvVar4 = Instruction::words(this_00);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar4);
      if (sVar5 == 4) {
        uVar2 = Instruction::word(this_00,3);
        *val = (ulong)uVar2;
      }
      else {
        pvVar4 = Instruction::words(this_00);
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar4);
        if (sVar5 != 5) {
          __assert_fail("inst->words().size() == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp"
                        ,0x56d,
                        "bool spvtools::val::ValidationState_t::EvalConstantValUint64(uint32_t, uint64_t *) const"
                       );
        }
        uVar2 = Instruction::word(this_00,3);
        *val = (ulong)uVar2;
        uVar2 = Instruction::word(this_00,4);
        *val = (ulong)uVar2 << 0x20 | *val;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValidationState_t::EvalConstantValUint64(uint32_t id,
                                              uint64_t* val) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    assert(0 && "Instruction not found");
    return false;
  }

  if (!IsIntScalarType(inst->type_id())) return false;

  if (inst->opcode() == spv::Op::OpConstantNull) {
    *val = 0;
  } else if (inst->opcode() != spv::Op::OpConstant) {
    // Spec constant values cannot be evaluated so don't consider constant for
    // static validation
    return false;
  } else if (inst->words().size() == 4) {
    *val = inst->word(3);
  } else {
    assert(inst->words().size() == 5);
    *val = inst->word(3);
    *val |= uint64_t(inst->word(4)) << 32;
  }
  return true;
}